

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_close_handle(LIBSSH2_SFTP_HANDLE *handle)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  uint32_t uVar5;
  ulong uVar6;
  uint32_t retcode;
  ssize_t nwritten;
  uchar *puStack_50;
  int rc;
  uchar *data;
  uchar *s;
  size_t sStack_38;
  uint32_t packet_len;
  size_t data_len;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SFTP *sftp;
  LIBSSH2_SFTP_HANDLE *handle_local;
  
  channel = (LIBSSH2_CHANNEL *)handle->sftp;
  session = (LIBSSH2_SESSION *)(channel->node).next;
  data_len = (size_t)session->kex_prefs;
  sStack_38 = 0;
  s._4_4_ = (int)handle->handle_len + 0xd;
  puStack_50 = (uchar *)0x0;
  nwritten._4_4_ = 0;
  sftp = (LIBSSH2_SFTP *)handle;
  if (handle->close_state == libssh2_NB_state_idle) {
    *(uint32_t *)&(channel->local).close = 0;
    data = (uchar *)(*((LIBSSH2_SESSION *)data_len)->alloc)((size_t)s._4_4_,(void **)data_len);
    sftp[1].channel = (LIBSSH2_CHANNEL *)data;
    if (sftp[1].channel == (LIBSSH2_CHANNEL *)0x0) {
      sftp->symlink_request_id = 0;
      nwritten._4_4_ =
           _libssh2_error((LIBSSH2_SESSION *)data_len,-6,
                          "Unable to allocate memory for FXP_CLOSE packet");
    }
    else {
      _libssh2_store_u32(&data,s._4_4_ - 4);
      *data = '\x04';
      iVar1 = *(int *)&(channel->node).prev;
      *(int *)&(channel->node).prev = iVar1 + 1;
      *(int *)&sftp->field_0x16c = iVar1;
      data = data + 1;
      _libssh2_store_u32(&data,*(uint32_t *)&sftp->field_0x16c);
      _libssh2_store_str(&data,(char *)&(sftp->packets).first,(size_t)sftp->statvfs_packet);
      sftp->symlink_request_id = 2;
    }
  }
  if (sftp->symlink_request_id == 2) {
    uVar6 = _libssh2_channel_write
                      ((LIBSSH2_CHANNEL *)session,0,(uchar *)sftp[1].channel,(ulong)s._4_4_);
    if (uVar6 == 0xffffffffffffffdb) {
      return -0x25;
    }
    if (s._4_4_ == uVar6) {
      sftp->symlink_request_id = 3;
    }
    else {
      sftp->symlink_request_id = 0;
      nwritten._4_4_ =
           _libssh2_error((LIBSSH2_SESSION *)data_len,-7,"Unable to send FXP_CLOSE command");
    }
    (**(code **)(data_len + 0x18))(sftp[1].channel,data_len);
    sftp[1].channel = (LIBSSH2_CHANNEL *)0x0;
  }
  if (sftp->symlink_request_id == 3) {
    nwritten._4_4_ =
         sftp_packet_require((LIBSSH2_SFTP *)channel,'e',*(uint32_t *)&sftp->field_0x16c,
                             &stack0xffffffffffffffb0,&stack0xffffffffffffffc8,9);
    if (nwritten._4_4_ == -0x25) {
      return -0x25;
    }
    if (nwritten._4_4_ == -0x26) {
      if (sStack_38 != 0) {
        (**(code **)(data_len + 0x18))(puStack_50,data_len);
      }
      puStack_50 = (uchar *)0x0;
      _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"Packet too short in FXP_CLOSE command");
    }
    else if (nwritten._4_4_ != 0) {
      _libssh2_error((LIBSSH2_SESSION *)data_len,nwritten._4_4_,"Error waiting for status message");
    }
    sftp->symlink_request_id = 4;
  }
  if (puStack_50 == (uchar *)0x0) {
    if (nwritten._4_4_ == 0) {
      __assert_fail("rc",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/palmin[P]libssh2/src/sftp.c"
                    ,0xaba,"int sftp_close_handle(LIBSSH2_SFTP_HANDLE *)");
    }
  }
  else {
    uVar5 = _libssh2_ntohu32(puStack_50 + 5);
    (**(code **)(data_len + 0x18))(puStack_50,data_len);
    if (uVar5 != 0) {
      (channel->local).close = (char)uVar5;
      (channel->local).eof = (char)(uVar5 >> 8);
      (channel->local).extended_data_ignore_mode = (char)(uVar5 >> 0x10);
      (channel->local).field_0x13 = (char)(uVar5 >> 0x18);
      sftp->symlink_request_id = 0;
      nwritten._4_4_ = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP Protocol Error");
    }
  }
  _libssh2_list_remove((list_node *)sftp);
  if (sftp->statvfs_request_id == 1) {
    if (*(int *)&sftp->mkdir_packet != 0) {
      uVar2._0_4_ = sftp->mkdir_request_id;
      uVar2._4_4_ = sftp->rmdir_state;
      (**(code **)(data_len + 0x18))(uVar2,data_len);
    }
  }
  else if ((sftp->statvfs_request_id == 0) &&
          (lVar3._0_4_ = sftp->rmdir_request_id, lVar3._4_4_ = sftp->stat_state, lVar3 != 0)) {
    uVar4._0_4_ = sftp->rmdir_request_id;
    uVar4._4_4_ = sftp->stat_state;
    (**(code **)(data_len + 0x18))(uVar4,data_len);
  }
  sftp_packetlist_flush((LIBSSH2_SFTP_HANDLE *)sftp);
  *(undefined4 *)&channel->field_0xa4 = 0;
  sftp->symlink_request_id = 0;
  (**(code **)(data_len + 0x18))(sftp,data_len);
  return nwritten._4_4_;
}

Assistant:

static int
sftp_close_handle(LIBSSH2_SFTP_HANDLE *handle)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    /* 13 = packet_len(4) + packet_type(1) + request_id(4) + handle_len(4) */
    uint32_t packet_len = (uint32_t)(handle->handle_len + 13);
    unsigned char *s, *data = NULL;
    int rc = 0;

    if(handle->close_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "Closing handle"));
        s = handle->close_packet = LIBSSH2_ALLOC(session, packet_len);
        if(!handle->close_packet) {
            handle->close_state = libssh2_NB_state_idle;
            rc = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for FXP_CLOSE "
                                "packet");
        }
        else {

            _libssh2_store_u32(&s, packet_len - 4);
            *(s++) = SSH_FXP_CLOSE;
            handle->close_request_id = sftp->request_id++;
            _libssh2_store_u32(&s, handle->close_request_id);
            _libssh2_store_str(&s, handle->handle, handle->handle_len);
            handle->close_state = libssh2_NB_state_created;
        }
    }

    if(handle->close_state == libssh2_NB_state_created) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(channel, 0, handle->close_packet,
                                          packet_len);
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            return (int)nwritten;
        }
        else if((ssize_t)packet_len != nwritten) {
            handle->close_state = libssh2_NB_state_idle;
            rc = _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                "Unable to send FXP_CLOSE command");
        }
        else
            handle->close_state = libssh2_NB_state_sent;

        LIBSSH2_FREE(session, handle->close_packet);
        handle->close_packet = NULL;
    }

    if(handle->close_state == libssh2_NB_state_sent) {
        rc = sftp_packet_require(sftp, SSH_FXP_STATUS,
                                 handle->close_request_id, &data,
                                 &data_len, 9);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
            if(data_len > 0) {
                LIBSSH2_FREE(session, data);
            }
            data = NULL;
            _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                           "Packet too short in FXP_CLOSE command");
        }
        else if(rc) {
            _libssh2_error(session, rc,
                           "Error waiting for status message");
        }

        handle->close_state = libssh2_NB_state_sent1;
    }

    if(!data) {
        /* if it reaches this point with data unset, something unwanted
           happened for which we should have set an error code */
        assert(rc);

    }
    else {
        uint32_t retcode = _libssh2_ntohu32(data + 5);
        LIBSSH2_FREE(session, data);

        if(retcode != LIBSSH2_FX_OK) {
            sftp->last_errno = retcode;
            handle->close_state = libssh2_NB_state_idle;
            rc = _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                "SFTP Protocol Error");
        }
    }

    /* remove this handle from the parent's list */
    _libssh2_list_remove(&handle->node);

    if(handle->handle_type == LIBSSH2_SFTP_HANDLE_DIR) {
        if(handle->u.dir.names_left)
            LIBSSH2_FREE(session, handle->u.dir.names_packet);
    }
    else if(handle->handle_type == LIBSSH2_SFTP_HANDLE_FILE) {
        if(handle->u.file.data)
            LIBSSH2_FREE(session, handle->u.file.data);
    }

    sftp_packetlist_flush(handle);
    sftp->read_state = libssh2_NB_state_idle;

    handle->close_state = libssh2_NB_state_idle;

    LIBSSH2_FREE(session, handle);

    return rc;
}